

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O3

void destroy_perDeviceData(HTTPTRANSPORT_PERDEVICE_DATA *perDeviceItem)

{
  STRING_delete(perDeviceItem->deviceId);
  perDeviceItem->deviceId = (STRING_HANDLE)0x0;
  STRING_delete(perDeviceItem->deviceKey);
  perDeviceItem->deviceKey = (STRING_HANDLE)0x0;
  STRING_delete(perDeviceItem->deviceSasToken);
  perDeviceItem->deviceSasToken = (STRING_HANDLE)0x0;
  STRING_delete(perDeviceItem->eventHTTPrelativePath);
  perDeviceItem->eventHTTPrelativePath = (STRING_HANDLE)0x0;
  STRING_delete(perDeviceItem->messageHTTPrelativePath);
  perDeviceItem->messageHTTPrelativePath = (STRING_HANDLE)0x0;
  HTTPHeaders_Free(perDeviceItem->eventHTTPrequestHeaders);
  perDeviceItem->eventHTTPrequestHeaders = (HTTP_HEADERS_HANDLE)0x0;
  HTTPHeaders_Free(perDeviceItem->messageHTTPrequestHeaders);
  perDeviceItem->messageHTTPrequestHeaders = (HTTP_HEADERS_HANDLE)0x0;
  STRING_delete(perDeviceItem->abandonHTTPrelativePathBegin);
  perDeviceItem->abandonHTTPrelativePathBegin = (STRING_HANDLE)0x0;
  HTTPAPIEX_SAS_Destroy(perDeviceItem->sasObject);
  perDeviceItem->sasObject = (HTTPAPIEX_SAS_HANDLE)0x0;
  return;
}

Assistant:

static void destroy_perDeviceData(HTTPTRANSPORT_PERDEVICE_DATA * perDeviceItem)
{
    destroy_deviceId(perDeviceItem);
    destroy_deviceKey(perDeviceItem);
    destroy_deviceSas(perDeviceItem);
    destroy_eventHTTPrelativePath(perDeviceItem);
    destroy_messageHTTPrelativePath(perDeviceItem);
    destroy_eventHTTPrequestHeaders(perDeviceItem);
    destroy_messageHTTPrequestHeaders(perDeviceItem);
    destroy_abandonHTTPrelativePathBegin(perDeviceItem);
    destroy_SASObject(perDeviceItem);
}